

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char * __thiscall pugi::xml_parse_result::description(xml_parse_result *this)

{
  xml_parse_result *this_local;
  
  switch(this->status) {
  case status_ok:
    this_local = (xml_parse_result *)anon_var_dwarf_10ba60;
    break;
  case status_file_not_found:
    this_local = (xml_parse_result *)anon_var_dwarf_10ba77;
    break;
  case status_io_error:
    this_local = (xml_parse_result *)anon_var_dwarf_10ba8e;
    break;
  case status_out_of_memory:
    this_local = (xml_parse_result *)anon_var_dwarf_10baa5;
    break;
  case status_internal_error:
    this_local = (xml_parse_result *)anon_var_dwarf_10babc;
    break;
  case status_unrecognized_tag:
    this_local = (xml_parse_result *)anon_var_dwarf_10bad3;
    break;
  case status_bad_pi:
    this_local = (xml_parse_result *)anon_var_dwarf_10bade;
    break;
  case status_bad_comment:
    this_local = (xml_parse_result *)anon_var_dwarf_10baf5;
    break;
  case status_bad_cdata:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb0c;
    break;
  case status_bad_doctype:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb17;
    break;
  case status_bad_pcdata:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb2e;
    break;
  case status_bad_start_element:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb39;
    break;
  case status_bad_attribute:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb50;
    break;
  case status_bad_end_element:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb5b;
    break;
  case status_end_element_mismatch:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb72;
    break;
  case status_append_invalid_root:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb7d;
    break;
  case status_no_document_element:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb88;
    break;
  default:
    this_local = (xml_parse_result *)anon_var_dwarf_10bb93;
  }
  return (char *)this_local;
}

Assistant:

PUGI_IMPL_FN const char* xml_parse_result::description() const
	{
		switch (status)
		{
		case status_ok: return "No error";

		case status_file_not_found: return "File was not found";
		case status_io_error: return "Error reading from file/stream";
		case status_out_of_memory: return "Could not allocate memory";
		case status_internal_error: return "Internal error occurred";

		case status_unrecognized_tag: return "Could not determine tag type";

		case status_bad_pi: return "Error parsing document declaration/processing instruction";
		case status_bad_comment: return "Error parsing comment";
		case status_bad_cdata: return "Error parsing CDATA section";
		case status_bad_doctype: return "Error parsing document type declaration";
		case status_bad_pcdata: return "Error parsing PCDATA section";
		case status_bad_start_element: return "Error parsing start element tag";
		case status_bad_attribute: return "Error parsing element attribute";
		case status_bad_end_element: return "Error parsing end element tag";
		case status_end_element_mismatch: return "Start-end tags mismatch";

		case status_append_invalid_root: return "Unable to append nodes: root is not an element or document";

		case status_no_document_element: return "No document element found";

		default: return "Unknown error";
		}
	}